

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

cio_error cio_uart_set_num_data_bits(cio_uart *port,cio_uart_num_data_bits num_data_bits)

{
  uint uVar1;
  cio_error cVar2;
  termios tty;
  termios local_4c;
  
  if (port == (cio_uart *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  cVar2 = get_current_settings(port,&local_4c);
  if (cVar2 != CIO_SUCCESS) {
    return cVar2;
  }
  switch(num_data_bits) {
  case CIO_UART_5_DATA_BITS:
    goto switchD_001016a4_caseD_0;
  case CIO_UART_6_DATA_BITS:
    uVar1 = 0x10;
    break;
  case CIO_UART_7_DATA_BITS:
    uVar1 = 0x20;
    break;
  case CIO_UART_8_DATA_BITS:
    uVar1 = 0x30;
    break;
  default:
    return CIO_INVALID_ARGUMENT;
  }
  local_4c.c_cflag = local_4c.c_cflag | uVar1;
switchD_001016a4_caseD_0:
  cVar2 = set_termios((port->impl).ev.fd,&local_4c);
  return cVar2;
}

Assistant:

enum cio_error cio_uart_set_num_data_bits(const struct cio_uart *port, enum cio_uart_num_data_bits num_data_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (num_data_bits) {
	case CIO_UART_5_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS5;
		break;
	case CIO_UART_6_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS6;
		break;
	case CIO_UART_7_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS7;
		break;
	case CIO_UART_8_DATA_BITS:
		tty.c_cflag |= (tcflag_t)CS8;
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}